

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::Type::Deserialize(Type *this,Parser *parser,Type *type)

{
  int *piVar1;
  ushort uVar2;
  pointer ppSVar3;
  StructDef *pSVar4;
  pointer ppEVar5;
  long lVar6;
  unsigned_short vtsize;
  uint16_t uVar7;
  ulong uVar8;
  BaseType BVar9;
  ulong uVar10;
  bool bVar11;
  
  if (type == (Type *)0x0) {
    return true;
  }
  lVar6 = -(long)*(int *)type;
  uVar2 = *(ushort *)(type + -(long)*(int *)type);
  if (uVar2 < 5) {
    this->base_type = BASE_TYPE_NONE;
LAB_00123b52:
    this->element = BASE_TYPE_NONE;
  }
  else {
    if ((ulong)*(ushort *)(type + lVar6 + 4) == 0) {
      BVar9 = BASE_TYPE_NONE;
    }
    else {
      BVar9 = (BaseType)(char)type[*(ushort *)(type + lVar6 + 4)].super_Table;
    }
    this->base_type = BVar9;
    if (uVar2 < 7) goto LAB_00123b52;
    if ((ulong)*(ushort *)(type + lVar6 + 6) == 0) {
      BVar9 = BASE_TYPE_NONE;
    }
    else {
      BVar9 = (BaseType)(char)type[*(ushort *)(type + lVar6 + 6)].super_Table;
    }
    this->element = BVar9;
    if ((10 < uVar2) && ((ulong)*(ushort *)(type + lVar6 + 10) != 0)) {
      uVar7 = *(uint16_t *)(type + *(ushort *)(type + lVar6 + 10));
      goto LAB_00123b5c;
    }
  }
  uVar7 = 0;
LAB_00123b5c:
  this->fixed_length = uVar7;
  if (((*(ushort *)(type + lVar6) < 9) || ((ulong)*(ushort *)(type + lVar6 + 8) == 0)) ||
     (uVar8 = (ulong)*(int *)(type + *(ushort *)(type + lVar6 + 8)), (long)uVar8 < 0)) {
    return true;
  }
  uVar10 = (ulong)*(ushort *)(type + lVar6 + 4);
  if (uVar10 != 0) {
    bVar11 = true;
    if (type[uVar10].super_Table != (Table)0xe) {
      bVar11 = type[uVar10].super_Table == (Table)0x11;
    }
    if ((type[uVar10].super_Table == (Table)0xf) ||
       (((bVar11 && ((ulong)*(ushort *)(type + lVar6 + 6) != 0)) &&
        (type[*(ushort *)(type + lVar6 + 6)].super_Table == (Table)0xf)))) {
      ppSVar3 = (parser->structs_).vec.
                super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(parser->structs_).vec.
                        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3) <= uVar8) {
        return false;
      }
      pSVar4 = ppSVar3[uVar8];
      this->struct_def = pSVar4;
      piVar1 = &(pSVar4->super_Definition).refcount;
      *piVar1 = *piVar1 + 1;
      return true;
    }
  }
  ppEVar5 = (parser->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(parser->enums_).vec.
                    super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3) <= uVar8) {
    return false;
  }
  this->enum_def = ppEVar5[uVar8];
  return true;
}

Assistant:

bool Type::Deserialize(const Parser &parser, const reflection::Type *type) {
  if (type == nullptr) return true;
  base_type = static_cast<BaseType>(type->base_type());
  element = static_cast<BaseType>(type->element());
  fixed_length = type->fixed_length();
  if (type->index() >= 0) {
    bool is_series = type->base_type() == reflection::Vector ||
                     type->base_type() == reflection::Array;
    if (type->base_type() == reflection::Obj ||
        (is_series && type->element() == reflection::Obj)) {
      if (static_cast<size_t>(type->index()) < parser.structs_.vec.size()) {
        struct_def = parser.structs_.vec[type->index()];
        struct_def->refcount++;
      } else {
        return false;
      }
    } else {
      if (static_cast<size_t>(type->index()) < parser.enums_.vec.size()) {
        enum_def = parser.enums_.vec[type->index()];
      } else {
        return false;
      }
    }
  }
  return true;
}